

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void mock_ping2(intptr_t uuid,fio_protocol_s *protocol)

{
  int iVar1;
  fio_protocol_s *protocol_local;
  intptr_t uuid_local;
  
  iVar1 = (int)((ulong)uuid >> 8);
  *(__time_t *)((long)fio_data + (long)iVar1 * 0xa8 + 0x60) = (fio_data->last_cycle).tv_sec;
  if (*(char *)((long)fio_data + (long)iVar1 * 0xa8 + 0x6a) != -1) {
    protocol->ping = mock_ping;
    *(undefined1 *)((long)fio_data + (long)iVar1 * 0xa8 + 0x6a) = 8;
    fio_close(uuid);
  }
  return;
}

Assistant:

static void mock_ping2(intptr_t uuid, fio_protocol_s *protocol) {
  (void)protocol;
  touchfd(fio_uuid2fd(uuid));
  if (uuid_data(uuid).timeout == 255)
    return;
  protocol->ping = mock_ping;
  uuid_data(uuid).timeout = 8;
  fio_close(uuid);
}